

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O2

Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> * __thiscall
anurbs::NurbsSurfaceGeometry<3L>::knots_v
          (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
           *__return_storage_ptr__,NurbsSurfaceGeometry<3L> *this)

{
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)
             __return_storage_ptr__,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_knots_v,(type *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Ref<const Eigen::VectorXd> knots_v() const
    {
        return m_knots_v;
    }